

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountFilter.cc
# Opt level: O0

void __thiscall
CountFilter::CountFilter
          (CountFilter *this,string *_kcname,string *_filter_count_name,int _filter_count_max,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_value_count_names,vector<int,_std::allocator<int>_> *_value_count_mins)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_R9;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  
  std::
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x50ab95);
  std::__cxx11::string::string((string *)(in_RDI + 0x30),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 0x50),in_RDX);
  *(undefined4 *)(in_RDI + 0x70) = in_ECX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_R9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffffc8);
  std::vector<int,_std::allocator<int>_>::vector(in_R9,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

CountFilter::CountFilter(std::string _kcname, std::string _filter_count_name, int _filter_count_max, const std::vector<std::string> _value_count_names,const std::vector<int> _value_count_mins):
        kcname(_kcname),
        filter_count_name(_filter_count_name),
        filter_count_max(_filter_count_max),
        value_count_names(_value_count_names),
        value_count_mins(_value_count_mins){}